

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O3

void __thiscall rsg::VariableType::Member::Member(Member *this,Member *other)

{
  pointer pcVar1;
  VariableType *other_00;
  VariableType *this_00;
  
  this->m_type = (VariableType *)0x0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (other->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + (other->m_name)._M_string_length);
  other_00 = other->m_type;
  if (other_00 != (VariableType *)0x0) {
    this_00 = (VariableType *)operator_new(0x50);
    VariableType(this_00,other_00);
    this->m_type = this_00;
  }
  return;
}

Assistant:

Member (const Member& other)
			: m_type(DE_NULL)
			, m_name(other.m_name)
		{
			if (other.m_type)
				m_type = new VariableType(*other.m_type);
		}